

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

int pbrt::GenerateLightSubpath
              (Integrator *integrator,SampledWavelengths *lambda,SamplerHandle *sampler,
              CameraHandle *camera,ScratchBuffer *scratchBuffer,int maxDepth,Float time,
              LightSamplerHandle lightSampler,Vertex *path,bool regularize)

{
  float fVar1;
  Interval<float> IVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Tuple2<pbrt::Point2,_float> TVar7;
  undefined1 auVar8 [32];
  byte bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  DebugMLTSampler *pDVar14;
  undefined4 uVar15;
  undefined4 in_register_0000008c;
  undefined8 uVar16;
  uint *puVar17;
  undefined1 auVar18 [16];
  Float FVar19;
  undefined1 auVar20 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar36 [64];
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  SampledSpectrum beta;
  optional<pbrt::SampledLight> sampledLight;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_238;
  float local_230;
  Float local_22c;
  Integrator *local_228;
  CameraHandle *local_220;
  undefined8 local_218;
  ScratchBuffer *local_210;
  undefined5 local_208;
  undefined3 uStack_203;
  undefined5 uStack_200;
  Float local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  Tuple2<pbrt::Point2,_float> local_1e8;
  Vector3f VStack_1dc;
  Float FStack_1d0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_1c8;
  uint local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  undefined4 uStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined8 uStack_19c;
  undefined8 uStack_194;
  LightLeSample les;
  undefined1 local_e8 [32];
  float local_c8 [6];
  LightSamplerHandle local_b0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_a8;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_a0;
  RayDifferential local_98;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  
  auVar18 = in_ZMM1._0_16_;
  uVar16 = CONCAT44(in_register_0000008c,maxDepth);
  if (maxDepth == 0) {
    return 0;
  }
  les.L.values.values._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_22c = time;
  local_220 = camera;
  local_218 = uVar16;
  local_210 = scratchBuffer;
  FVar19 = detail::DispatchSplit<8>::operator()
                     ((DispatchSplit<8> *)&local_1e8,&les,(ulong)les.L.values.values._0_8_ >> 0x30);
  uVar15 = (undefined4)uVar16;
  uVar12 = *(ulong *)lightSampler.
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
  if ((ushort)(uVar12 >> 0x30) < 3) {
    if ((uVar12 & 0x3000000000000) == 0x2000000000000) {
      PowerLightSampler::Sample(&sampledLight,(PowerLightSampler *)(uVar12 & 0xffffffffffff),FVar19)
      ;
      bVar9 = sampledLight.set;
      goto LAB_00454ba7;
    }
LAB_00454b4a:
    lVar13 = *(long *)((uVar12 & 0xffffffffffff) + 0x18);
    if (lVar13 == 0) goto LAB_00454b8f;
    auVar18 = vcvtusi2ss_avx512f(auVar18,lVar13);
    iVar11 = (int)lVar13 + -1;
    fVar37 = auVar18._0_4_;
    if ((int)(FVar19 * fVar37) <= iVar11) {
      iVar11 = (int)(FVar19 * fVar37);
    }
    lVar13 = *(long *)((uVar12 & 0xffffffffffff) + 8);
LAB_00454b6f:
    bVar9 = true;
    sampledLight.optionalValue._8_4_ = 1.0 / fVar37;
    sampledLight.optionalValue.__align =
         (anon_struct_8_0_00000001_for___align)*(undefined8 *)(lVar13 + (long)iVar11 * 8);
  }
  else {
    if ((uVar12 & 0xfffe000000000000) != 0x2000000000000) goto LAB_00454b4a;
    lVar13 = *(long *)((uVar12 & 0xffffffffffff) + 0x20);
    if (lVar13 != 0) {
      auVar18 = vcvtusi2ss_avx512f(auVar18,lVar13);
      iVar11 = (int)lVar13 + -1;
      fVar37 = auVar18._0_4_;
      if ((int)(FVar19 * fVar37) <= iVar11) {
        iVar11 = (int)(FVar19 * fVar37);
      }
      lVar13 = *(long *)((uVar12 & 0xffffffffffff) + 0x10);
      goto LAB_00454b6f;
    }
LAB_00454b8f:
    sampledLight.optionalValue._0_12_ = ZEXT412(0);
    sampledLight.optionalValue._12_4_ = 0;
    sampledLight.set = false;
    sampledLight._17_7_ = 0;
    bVar9 = false;
  }
  sampledLight.set = (bool)bVar9;
LAB_00454ba7:
  iVar11 = 0;
  if ((bVar9 & 1) != 0) {
    local_238 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)
                sampledLight.optionalValue.__align;
    local_230 = (float)sampledLight.optionalValue._8_4_;
    uVar12 = (sampler->
             super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
    uVar10 = (uint)(ushort)(uVar12 >> 0x30);
    local_228 = integrator;
    if (uVar12 >> 0x30 < 5) {
      if (uVar12 < 0x3000000000000) {
        if (uVar10 == 2) {
          auVar21._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar12 & 0xffffffffffff))
          ;
          auVar21._8_56_ = extraout_var_01;
          auVar18 = auVar21._0_16_;
        }
        else {
          auVar25._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar12 & 0xffffffffffff));
          auVar25._8_56_ = extraout_var_05;
          auVar18 = auVar25._0_16_;
        }
      }
      else if ((uVar10 & 6) == 2) {
        auVar23._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar12 & 0xffffffffffff));
        auVar23._8_56_ = extraout_var_03;
        auVar18 = auVar23._0_16_;
      }
      else {
        auVar27._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar12 & 0xffffffffffff));
        auVar27._8_56_ = extraout_var_07;
        auVar18 = auVar27._0_16_;
      }
    }
    else {
      uVar10 = uVar10 - 4;
      if (uVar10 < 3) {
        if (uVar10 == 2) {
          auVar22._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar12 & 0xffffffffffff));
          auVar22._8_56_ = extraout_var_02;
          auVar18 = auVar22._0_16_;
        }
        else {
          auVar26._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar12 & 0xffffffffffff));
          auVar26._8_56_ = extraout_var_06;
          auVar18 = auVar26._0_16_;
        }
      }
      else {
        pDVar14 = (DebugMLTSampler *)(uVar12 & 0xffffffffffff);
        if ((uVar10 & 0x7ffffffe) == 2) {
          auVar24._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar14);
          auVar24._8_56_ = extraout_var_04;
          auVar18 = auVar24._0_16_;
        }
        else {
          local_1f8 = DebugMLTSampler::Get1D(pDVar14);
          uStack_1f4 = extraout_XMM0_Db;
          uStack_1f0 = extraout_XMM0_Dc;
          uStack_1ec = extraout_XMM0_Dd;
          auVar28._0_4_ = DebugMLTSampler::Get1D(pDVar14);
          auVar28._4_60_ = extraout_var;
          auVar18._4_4_ = uStack_1f4;
          auVar18._0_4_ = local_1f8;
          auVar18._8_4_ = uStack_1f0;
          auVar18._12_4_ = uStack_1ec;
          auVar18 = vinsertps_avx(auVar18,auVar28._0_16_,0x10);
        }
      }
    }
    local_1e8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar18);
    uVar12 = (sampler->
             super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
    uVar10 = (uint)(ushort)(uVar12 >> 0x30);
    if (uVar12 < 0x5000000000000) {
      if (uVar12 < 0x3000000000000) {
        if (uVar10 == 2) {
          auVar29._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar12 & 0xffffffffffff))
          ;
          auVar29._8_56_ = extraout_var_08;
          auVar18 = auVar29._0_16_;
        }
        else {
          auVar33._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar12 & 0xffffffffffff));
          auVar33._8_56_ = extraout_var_12;
          auVar18 = auVar33._0_16_;
        }
      }
      else if ((uVar10 & 6) == 2) {
        auVar31._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar12 & 0xffffffffffff));
        auVar31._8_56_ = extraout_var_10;
        auVar18 = auVar31._0_16_;
      }
      else {
        auVar35._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar12 & 0xffffffffffff));
        auVar35._8_56_ = extraout_var_14;
        auVar18 = auVar35._0_16_;
      }
    }
    else {
      uVar10 = uVar10 - 4;
      if (uVar10 < 3) {
        if (uVar10 == 2) {
          auVar30._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar12 & 0xffffffffffff));
          auVar30._8_56_ = extraout_var_09;
          auVar18 = auVar30._0_16_;
        }
        else {
          auVar34._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar12 & 0xffffffffffff));
          auVar34._8_56_ = extraout_var_13;
          auVar18 = auVar34._0_16_;
        }
      }
      else {
        pDVar14 = (DebugMLTSampler *)(uVar12 & 0xffffffffffff);
        if ((uVar10 & 0x7ffffffe) == 2) {
          auVar32._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar14);
          auVar32._8_56_ = extraout_var_11;
          auVar18 = auVar32._0_16_;
        }
        else {
          local_1f8 = DebugMLTSampler::Get1D(pDVar14);
          uStack_1f4 = extraout_XMM0_Db_00;
          uStack_1f0 = extraout_XMM0_Dc_00;
          uStack_1ec = extraout_XMM0_Dd_00;
          auVar36._0_4_ = DebugMLTSampler::Get1D(pDVar14);
          auVar36._4_60_ = extraout_var_00;
          auVar4._4_4_ = uStack_1f4;
          auVar4._0_4_ = local_1f8;
          auVar4._8_4_ = uStack_1f0;
          auVar4._12_4_ = uStack_1ec;
          auVar18 = vinsertps_avx(auVar4,auVar36._0_16_,0x10);
        }
      }
    }
    local_e8._0_8_ = vmovlps_avx(auVar18);
    LightHandle::SampleLe
              (&les,&local_238.light,(Point2f *)&local_1e8,(Point2f *)local_e8,lambda,local_22c);
    uVar10 = local_1c0;
    iVar11 = 0;
    if ((les.pdfPos != 0.0) || (NAN(les.pdfPos))) {
      uVar12 = vcmpps_avx512vl(ZEXT816(0) << 0x40,ZEXT416((uint)les.pdfPos),5);
      uVar3 = vcmpps_avx512vl(ZEXT816(0) << 0x40,ZEXT416((uint)les.pdfDir),5);
      if (((uVar12 & uVar3 & 1) == 0) && ((les.pdfDir != 0.0 || (NAN(les.pdfDir))))) {
        fVar37 = les.L.values.values[0];
        if ((les.L.values.values[0] == 0.0) && (!NAN(les.L.values.values[0]))) {
          uVar12 = 0xffffffffffffffff;
          do {
            if (uVar12 == 2) {
              return 0;
            }
            fVar38 = les.L.values.values[uVar12 + 2];
            uVar12 = uVar12 + 1;
          } while ((fVar38 == 0.0) && (!NAN(fVar38)));
          if (2 < uVar12) {
            return 0;
          }
        }
        VStack_1dc.super_Tuple3<pbrt::Vector3,_float>.y =
             les.ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
        VStack_1dc.super_Tuple3<pbrt::Vector3,_float>.z =
             les.ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
        FStack_1d0 = les.ray.time;
        uVar16 = stack0xfffffffffffffe2c;
        local_1e8.x = les.ray.o.super_Tuple3<pbrt::Point3,_float>.x;
        local_1e8.y = les.ray.o.super_Tuple3<pbrt::Point3,_float>.y;
        TVar7 = local_1e8;
        VStack_1dc.super_Tuple3<pbrt::Vector3,_float>.x =
             les.ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
        local_1c8 = les.ray.medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits;
        local_1c0 = local_1c0 & 0xffffff00;
        fStack_1bc = 0.0;
        _fStack_1b8 = SUB168(ZEXT816(0) << 0x40,4);
        uStack_1b0 = 0;
        fStack_1a8 = 0.0;
        uStack_1a4 = 0;
        uStack_19c = 0;
        uStack_194 = 0;
        if (les.intr.set == true) {
          local_e8._12_4_ = les.intr.optionalValue._40_4_;
          local_e8._8_4_ = les.intr.optionalValue._36_4_;
          local_e8._20_4_ = les.intr.optionalValue._48_4_;
          local_e8._16_4_ = les.intr.optionalValue._44_4_;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = les.intr.optionalValue.__align;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = les.intr.optionalValue._8_8_;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = les.intr.optionalValue._16_8_;
          local_e8._0_8_ = les.intr.optionalValue._28_8_;
          local_e8._24_8_ = les.intr.optionalValue._52_8_;
          uVar15 = les.intr.optionalValue._60_4_;
        }
        else {
          local_1e8.x = les.ray.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar42._4_4_ = local_1e8.x;
          auVar42._0_4_ = local_1e8.x;
          auVar42._8_4_ = local_1e8.x;
          auVar42._12_4_ = local_1e8.x;
          local_1e8.y = les.ray.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar43._4_4_ = local_1e8.y;
          auVar43._0_4_ = local_1e8.y;
          auVar43._8_4_ = local_1e8.y;
          auVar43._12_4_ = local_1e8.y;
          auVar40._4_4_ = les.ray.o.super_Tuple3<pbrt::Point3,_float>.z;
          auVar40._0_4_ = les.ray.o.super_Tuple3<pbrt::Point3,_float>.z;
          auVar40._8_4_ = les.ray.o.super_Tuple3<pbrt::Point3,_float>.z;
          auVar40._12_4_ = les.ray.o.super_Tuple3<pbrt::Point3,_float>.z;
          FStack_1d0 = les.ray.time;
          local_e8 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar41._8_8_ = 0;
          auVar41._0_8_ =
               les.ray.medium.
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               .bits;
          les.intr.optionalValue._64_16_ = vpslldq_avx(auVar41,8);
          les.intr.optionalValue._24_4_ = FStack_1d0;
        }
        auVar8 = local_e8;
        auVar18 = vmovlhps_avx(auVar42,auVar43);
        local_208 = 0;
        uStack_203 = 0;
        uStack_200 = 0;
        local_c8[0] = les.L.values.values[0];
        local_c8[1] = les.L.values.values[1];
        path->type = Light;
        *(undefined8 *)(path->beta).values.values = les.L.values.values._0_8_;
        *(ulong *)((path->beta).values.values + 2) =
             CONCAT44(les.L.values.values[3],les.L.values.values[2]);
        *(undefined1 (*) [16])&path->field_2 = auVar18;
        IVar2 = (Interval<float>)vmovlps_avx(auVar40);
        (path->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar2;
        (path->field_2).ei.super_Interaction.time = (Float)les.intr.optionalValue._24_4_;
        (((Interaction *)&path->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.x =
             (float)local_e8._0_4_;
        (((Interaction *)&path->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)local_e8._4_4_;
        *(undefined8 *)&(path->field_2).ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z
             = local_e8._8_8_;
        (((Interaction *)&path->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.y =
             (float)local_e8._16_4_;
        (((Interaction *)&path->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.z =
             (float)local_e8._20_4_;
        (path->field_2).ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float> =
             (Tuple2<pbrt::Point2,_float>)local_e8._24_8_;
        *(undefined4 *)&(path->field_2).ei.super_Interaction.field_0x3c = uVar15;
        *(undefined1 (*) [16])((long)&path->field_2 + 0x40) = les.intr.optionalValue._64_16_;
        (path->field_2).ei.field_0 = local_238;
        (path->bsdf).bxdf.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
        .bits = 0;
        (path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
        (path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        *(undefined8 *)&(path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
        (path->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
        (path->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
        (path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
        (path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
        *(undefined8 *)((long)&(path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) = 0;
        path->pdfFwd = les.pdfPos * local_230;
        path->pdfRev = 0.0;
        if (les.intr.set == false) {
          fVar38 = 1.0;
        }
        else {
          VStack_1dc.super_Tuple3<pbrt::Vector3,_float>.z =
               les.ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar18 = vfmadd132ss_fma(ZEXT416((uint)les.intr.optionalValue._44_4_),
                                    ZEXT416((uint)((float)les.intr.optionalValue._48_4_ *
                                                  VStack_1dc.super_Tuple3<pbrt::Vector3,_float>.z)),
                                    ZEXT416((uint)les.ray.d.super_Tuple3<pbrt::Vector3,_float>.y));
          auVar4 = vfmsub213ss_fma(ZEXT416((uint)VStack_1dc.super_Tuple3<pbrt::Vector3,_float>.z),
                                   ZEXT416((uint)les.intr.optionalValue._48_4_),
                                   ZEXT416((uint)((float)les.intr.optionalValue._48_4_ *
                                                 VStack_1dc.super_Tuple3<pbrt::Vector3,_float>.z)));
          auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ + auVar4._0_4_)),
                                    ZEXT416((uint)les.intr.optionalValue._40_4_),
                                    ZEXT416((uint)les.ray.d.super_Tuple3<pbrt::Vector3,_float>.x));
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar18 = vandps_avx512vl(auVar18,auVar5);
          fVar38 = auVar18._0_4_;
        }
        auVar39._0_4_ = fVar38 * fVar37;
        auVar39._4_4_ = fVar38 * les.L.values.values[1];
        auVar39._8_4_ = fVar38 * les.L.values.values[2];
        auVar39._12_4_ = fVar38 * les.L.values.values[3];
        fVar37 = les.pdfPos * local_230 * les.pdfDir;
        auVar20._4_4_ = fVar37;
        auVar20._0_4_ = fVar37;
        auVar20._8_4_ = fVar37;
        auVar20._12_4_ = fVar37;
        auVar18 = vdivps_avx(auVar39,auVar20);
        local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
             les.ray.o.super_Tuple3<pbrt::Point3,_float>.x;
        local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
             les.ray.o.super_Tuple3<pbrt::Point3,_float>.y;
        local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
             les.ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
        local_98.super_Ray.time = les.ray.time;
        local_98._40_8_ = (ulong)uVar10 & 0xffffffffffffff00;
        local_98.super_Ray.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = les.ray.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
        local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y = fStack_1b8;
        local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = fStack_1b4;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        auVar4 = vshufpd_avx(auVar18,auVar18,1);
        local_a0.bits =
             (sampler->
             super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
        local_a8.bits =
             (local_220->
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             ).bits;
        beta.values.values._0_8_ = auVar18._0_8_;
        beta.values.values._8_8_ = auVar4._0_8_;
        local_1e8 = TVar7;
        unique0x100011aa = uVar16;
        fStack_1ac = fStack_1bc;
        uStack_1a0 = uStack_1b0;
        local_e8 = auVar8;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = fStack_1bc;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = fStack_1a8;
        iVar11 = RandomWalk(local_228,lambda,&local_98,(SamplerHandle *)&local_a0,
                            (CameraHandle *)&local_a8,local_210,beta,les.pdfDir,(int)local_218 + -1,
                            Importance,path + 1,regularize);
        if ((path->type == Light) &&
           ((puVar17 = (uint *)((ulong)(path->field_2).ei.field_0 & 0xffffffffffff),
            puVar17 == (uint *)0x0 || ((*puVar17 & 0xfffffffd) == 1)))) {
          if (0 < iVar11) {
            path[1].pdfFwd = les.pdfPos;
            fVar37 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
            fVar38 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
            fVar1 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
            if ((((fVar37 != 0.0) || (fVar38 != 0.0)) || (fVar1 != 0.0)) || (NAN(fVar1))) {
              auVar18 = vfmadd132ss_fma(ZEXT416((uint)fVar38),
                                        ZEXT416((uint)(fVar1 * VStack_1dc.
                                                               super_Tuple3<pbrt::Vector3,_float>.z)
                                               ),ZEXT416((uint)VStack_1dc.
                                                               super_Tuple3<pbrt::Vector3,_float>.y)
                                       );
              auVar4 = vfmsub213ss_fma(ZEXT416((uint)VStack_1dc.super_Tuple3<pbrt::Vector3,_float>.z
                                              ),ZEXT416((uint)fVar1),
                                       ZEXT416((uint)(fVar1 * VStack_1dc.
                                                              super_Tuple3<pbrt::Vector3,_float>.z))
                                      );
              auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ + auVar4._0_4_)),
                                        ZEXT416((uint)fVar37),
                                        ZEXT416((uint)VStack_1dc.super_Tuple3<pbrt::Vector3,_float>.
                                                      x));
              auVar6._8_4_ = 0x7fffffff;
              auVar6._0_8_ = 0x7fffffff7fffffff;
              auVar6._12_4_ = 0x7fffffff;
              auVar18 = vandps_avx512vl(auVar18,auVar6);
              path[1].pdfFwd = les.pdfPos * auVar18._0_4_;
            }
          }
          local_b0.
          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                    *)lightSampler.
                      super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                      .bits;
          FVar19 = InfiniteLightDensity(&local_228->infiniteLights,&local_b0,&VStack_1dc);
          path->pdfFwd = FVar19;
        }
        iVar11 = iVar11 + 1;
      }
    }
  }
  return iVar11;
}

Assistant:

int GenerateLightSubpath(const Integrator &integrator, SampledWavelengths &lambda,
                         SamplerHandle sampler, CameraHandle camera,
                         ScratchBuffer &scratchBuffer, int maxDepth, Float time,
                         LightSamplerHandle lightSampler, Vertex *path, bool regularize) {
    if (maxDepth == 0)
        return 0;
    // Sample initial ray for light subpath
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(sampler.Get1D());
    if (!sampledLight)
        return 0;
    LightHandle light = sampledLight->light;
    Float lightPDF = sampledLight->pdf;
    LightLeSample les = light.SampleLe(sampler.Get2D(), sampler.Get2D(), lambda, time);
    if (!les || les.pdfPos == 0 || les.pdfDir == 0 || !les.L)
        return 0;
    RayDifferential ray(les.ray);

    // Generate first vertex on light subpath and start random walk
    path[0] = les.intr ? Vertex::CreateLight(light, ray, *les.intr, les.L,
                                             les.pdfPos * lightPDF)
                       : Vertex::CreateLight(light, ray, les.L, les.pdfPos * lightPDF);
    SampledSpectrum beta =
        les.L * les.AbsCosTheta(ray.d) / (lightPDF * les.pdfPos * les.pdfDir);
    PBRT_DBG("%s\n",
             StringPrintf(
                 "Starting light subpath. Ray: %s, Le %s, beta %s, pdfPos %f, pdfDir %f",
                 ray, les.L, beta, les.pdfPos, les.pdfDir)
                 .c_str());
    int nVertices = RandomWalk(integrator, lambda, ray, sampler, camera, scratchBuffer,
                               beta, les.pdfDir, maxDepth - 1, TransportMode::Importance,
                               path + 1, regularize);
    // Correct subpath sampling densities for infinite area lights
    if (path[0].IsInfiniteLight()) {
        // Set spatial density of _path[1]_ for infinite area light
        if (nVertices > 0) {
            path[1].pdfFwd = les.pdfPos;
            if (path[1].IsOnSurface())
                path[1].pdfFwd *= AbsDot(ray.d, path[1].ng());
        }

        // Set spatial density of _path[0]_ for infinite area light
        path[0].pdfFwd =
            InfiniteLightDensity(integrator.infiniteLights, lightSampler, ray.d);
    }

    return nVertices + 1;
}